

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scaleElement(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *__return_storage_ptr__,
              SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *lp,int row,int col,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *val)

{
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  int local_60;
  undefined1 local_5c;
  undefined8 local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_48;
  
  local_88 = *(undefined8 *)(val->m_backend).data._M_elems;
  uStack_80 = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_78 = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  uStack_70 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_68 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_60 = (val->m_backend).exp;
  local_5c = (val->m_backend).neg;
  local_58._0_4_ = (val->m_backend).fpclass;
  local_58._4_4_ = (val->m_backend).prec_elem;
  spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&local_48,(soplex *)&local_88,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(ulong)(uint)((lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).scaleExp.data[row] +
                             (lp->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).scaleExp.data[col]),row);
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
       local_48.m_backend.data._M_elems._32_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
       local_48.m_backend.data._M_elems._16_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
       local_48.m_backend.data._M_elems._24_8_;
  *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
       local_48.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
       local_48.m_backend.data._M_elems._8_8_;
  (__return_storage_ptr__->m_backend).exp = local_48.m_backend.exp;
  (__return_storage_ptr__->m_backend).neg = local_48.m_backend.neg;
  (__return_storage_ptr__->m_backend).fpclass = local_48.m_backend.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = local_48.m_backend.prec_elem;
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::scaleElement(const SPxLPBase<R>& lp, int row, int col, R val) const
{
   assert(lp.isScaled());
   assert(col < lp.nCols());
   assert(col >= 0);
   assert(row < lp.nRows());
   assert(row >= 0);

   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   return spxLdexp(val, colscaleExp[col] + rowscaleExp[row]);
}